

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O1

kappa_pair_type floaxie::calculate_kappa_div(half_of_mantissa_storage_type n)

{
  kappa_pair_type kVar1;
  kappa_pair_type kVar2;
  kappa_pair_type kVar3;
  kappa_pair_type kVar4;
  kappa_pair_type kVar5;
  kappa_pair_type kVar6;
  kappa_pair_type kVar7;
  kappa_pair_type kVar8;
  kappa_pair_type kVar9;
  
  if (n < 10) {
    kVar1.first = '\x01';
    kVar1._1_3_ = 0;
    kVar1.second = 1;
    return kVar1;
  }
  if (n < 100) {
    kVar2.first = '\x02';
    kVar2._1_3_ = 0;
    kVar2.second = 10;
    return kVar2;
  }
  if (n < 1000) {
    kVar3.first = '\x03';
    kVar3._1_3_ = 0;
    kVar3.second = 100;
    return kVar3;
  }
  if (n < 10000) {
    kVar4.first = '\x04';
    kVar4._1_3_ = 0;
    kVar4.second = 1000;
    return kVar4;
  }
  if (n < 100000) {
    kVar5.first = '\x05';
    kVar5._1_3_ = 0;
    kVar5.second = 10000;
    return kVar5;
  }
  if (n < 1000000) {
    kVar6.first = '\x06';
    kVar6._1_3_ = 0;
    kVar6.second = 100000;
    return kVar6;
  }
  if (n < 10000000) {
    kVar7.first = '\a';
    kVar7._1_3_ = 0;
    kVar7.second = 1000000;
    return kVar7;
  }
  if (n < 100000000) {
    kVar8.first = '\b';
    kVar8._1_3_ = 0;
    kVar8.second = 10000000;
    return kVar8;
  }
  kVar9.first = '\n';
  kVar9._1_3_ = 0;
  kVar9.second = 1000000000;
  if (n < 1000000000) {
    kVar9.first = '\t';
    kVar9._1_3_ = 0;
    kVar9.second = 100000000;
  }
  return kVar9;
}

Assistant:

constexpr kappa_pair_type calculate_kappa_div(half_of_mantissa_storage_type n) noexcept
	{
		if (n < static_pow<10, 1>()) return make_kappa_div<1>();
		if (n < static_pow<10, 2>()) return make_kappa_div<2>();
		if (n < static_pow<10, 3>()) return make_kappa_div<3>();
		if (n < static_pow<10, 4>()) return make_kappa_div<4>();
		if (n < static_pow<10, 5>()) return make_kappa_div<5>();
		if (n < static_pow<10, 6>()) return make_kappa_div<6>();
		if (n < static_pow<10, 7>()) return make_kappa_div<7>();
		if (n < static_pow<10, 8>()) return make_kappa_div<8>();
		if (n < static_pow<10, 9>()) return make_kappa_div<9>();
		return make_kappa_div<10>();
	}